

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL>::push_back
          (SmallVector<spirv_cross::HLSLVertexAttributeRemap,_8UL> *this,HLSLVertexAttributeRemap *t
          )

{
  size_t *psVar1;
  string *psVar2;
  HLSLVertexAttributeRemap *pHVar3;
  size_t sVar4;
  pointer pcVar5;
  string *psVar6;
  
  reserve(this,(this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size + 1);
  pHVar3 = (this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).ptr;
  sVar4 = (this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size;
  psVar2 = &pHVar3[sVar4].semantic;
  *(uint32_t *)((long)(psVar2 + -1) + 0x18) = t->location;
  psVar6 = &pHVar3[sVar4].semantic;
  (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
  pcVar5 = (t->semantic)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)psVar2,pcVar5,pcVar5 + (t->semantic)._M_string_length);
  psVar1 = &(this->super_VectorView<spirv_cross::HLSLVertexAttributeRemap>).buffer_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void push_back(const T &t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(t);
		this->buffer_size++;
	}